

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  ulong uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 (*pauVar37) [16];
  int iVar38;
  uint uVar39;
  uint uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  undefined1 (*pauVar46) [16];
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  ulong unaff_R15;
  size_t mask;
  vint4 bi_1;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  vint4 bi;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  vint4 ai;
  undefined1 auVar65 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  float fVar76;
  undefined1 auVar77 [32];
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar78 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  uint uVar85;
  uint uVar86;
  undefined1 auVar84 [64];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_1450;
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar63 [32];
  undefined1 auVar69 [32];
  
  pauVar46 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1370._4_4_ = fVar2;
  local_1370._0_4_ = fVar2;
  local_1370._8_4_ = fVar2;
  local_1370._12_4_ = fVar2;
  auVar75 = ZEXT1664(local_1370);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1380._4_4_ = fVar3;
  local_1380._0_4_ = fVar3;
  local_1380._8_4_ = fVar3;
  local_1380._12_4_ = fVar3;
  auVar78 = ZEXT1664(local_1380);
  fVar76 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1390._4_4_ = fVar76;
  local_1390._0_4_ = fVar76;
  local_1390._8_4_ = fVar76;
  local_1390._12_4_ = fVar76;
  auVar84 = ZEXT1664(local_1390);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar76 = fVar76 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar38 = (tray->tfar).field_0.i[k];
  auVar53 = ZEXT1664(CONCAT412(iVar38,CONCAT48(iVar38,CONCAT44(iVar38,iVar38))));
  local_13a0._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_13a0._8_4_ = -fVar2;
  local_13a0._12_4_ = -fVar2;
  auVar89 = ZEXT1664(local_13a0);
  local_13b0._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_13b0._8_4_ = -fVar3;
  local_13b0._12_4_ = -fVar3;
  auVar91 = ZEXT1664(local_13b0);
  local_13c0._0_8_ = CONCAT44(fVar76,fVar76) ^ 0x8000000080000000;
  local_13c0._8_4_ = -fVar76;
  local_13c0._12_4_ = -fVar76;
  auVar94 = ZEXT1664(local_13c0);
  iVar38 = (tray->tnear).field_0.i[k];
  local_13d0._4_4_ = iVar38;
  local_13d0._0_4_ = iVar38;
  local_13d0._8_4_ = iVar38;
  local_13d0._12_4_ = iVar38;
  auVar96 = ZEXT1664(local_13d0);
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  iVar38 = 1 << ((uint)k & 0x1f);
  auVar74._4_4_ = iVar38;
  auVar74._0_4_ = iVar38;
  auVar74._8_4_ = iVar38;
  auVar74._12_4_ = iVar38;
  auVar74._16_4_ = iVar38;
  auVar74._20_4_ = iVar38;
  auVar74._24_4_ = iVar38;
  auVar74._28_4_ = iVar38;
  auVar55 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar74 = vpand_avx2(auVar74,auVar55);
  local_1140 = vpcmpeqd_avx2(auVar74,auVar55);
  auVar60._8_4_ = 0x3f800000;
  auVar60._0_8_ = &DAT_3f8000003f800000;
  auVar60._12_4_ = 0x3f800000;
  auVar60._16_4_ = 0x3f800000;
  auVar60._20_4_ = 0x3f800000;
  auVar60._24_4_ = 0x3f800000;
  auVar60._28_4_ = 0x3f800000;
  auVar55._8_4_ = 0xbf800000;
  auVar55._0_8_ = 0xbf800000bf800000;
  auVar55._12_4_ = 0xbf800000;
  auVar55._16_4_ = 0xbf800000;
  auVar55._20_4_ = 0xbf800000;
  auVar55._24_4_ = 0xbf800000;
  auVar55._28_4_ = 0xbf800000;
  local_1120 = vblendvps_avx(auVar60,auVar55,local_1100);
  do {
    do {
      do {
        if (pauVar46 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar37 = pauVar46 + -1;
        pauVar46 = pauVar46 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar37 + 8));
      uVar48 = *(ulong *)*pauVar46;
      do {
        if ((uVar48 & 8) == 0) {
          auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar48 + 0x20 + uVar44),auVar89._0_16_,
                                    auVar75._0_16_);
          auVar58 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar48 + 0x20 + uVar45),auVar91._0_16_,
                                    auVar78._0_16_);
          auVar54 = vpmaxsd_avx(auVar54,auVar58);
          auVar58 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar48 + 0x20 + uVar42),auVar94._0_16_,
                                    auVar84._0_16_);
          auVar58 = vpmaxsd_avx(auVar58,auVar96._0_16_);
          auVar58 = vpmaxsd_avx(auVar54,auVar58);
          auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar48 + 0x20 + (uVar44 ^ 0x10)),
                                    auVar89._0_16_,auVar75._0_16_);
          auVar64 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar48 + 0x20 + (uVar45 ^ 0x10)),
                                    auVar91._0_16_,auVar78._0_16_);
          auVar54 = vpminsd_avx(auVar54,auVar64);
          auVar64 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar48 + 0x20 + (uVar42 ^ 0x10)),
                                    auVar94._0_16_,auVar84._0_16_);
          auVar64 = vpminsd_avx(auVar64,auVar53._0_16_);
          auVar54 = vpminsd_avx(auVar54,auVar64);
          auVar54 = vpcmpgtd_avx(auVar58,auVar54);
          uVar39 = vmovmskps_avx(auVar54);
          unaff_R15 = ((ulong)uVar39 ^ 0xf) & 0xff;
          local_1340._0_16_ = auVar58;
        }
        if ((uVar48 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar38 = 4;
          }
          else {
            uVar47 = uVar48 & 0xfffffffffffffff0;
            lVar49 = 0;
            for (uVar48 = unaff_R15; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
              lVar49 = lVar49 + 1;
            }
            iVar38 = 0;
            uVar43 = unaff_R15 - 1 & unaff_R15;
            uVar48 = *(ulong *)(uVar47 + lVar49 * 8);
            if (uVar43 != 0) {
              uVar39 = *(uint *)(local_1340 + lVar49 * 4);
              lVar49 = 0;
              for (uVar27 = uVar43; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                lVar49 = lVar49 + 1;
              }
              uVar43 = uVar43 - 1 & uVar43;
              uVar27 = *(ulong *)(uVar47 + lVar49 * 8);
              uVar40 = *(uint *)(local_1340 + lVar49 * 4);
              if (uVar43 == 0) {
                if (uVar39 < uVar40) {
                  *(ulong *)*pauVar46 = uVar27;
                  *(uint *)(*pauVar46 + 8) = uVar40;
                  pauVar46 = pauVar46 + 1;
                }
                else {
                  *(ulong *)*pauVar46 = uVar48;
                  *(uint *)(*pauVar46 + 8) = uVar39;
                  pauVar46 = pauVar46 + 1;
                  uVar48 = uVar27;
                }
              }
              else {
                auVar54._8_8_ = 0;
                auVar54._0_8_ = uVar48;
                auVar54 = vpunpcklqdq_avx(auVar54,ZEXT416(uVar39));
                auVar58._8_8_ = 0;
                auVar58._0_8_ = uVar27;
                auVar58 = vpunpcklqdq_avx(auVar58,ZEXT416(uVar40));
                lVar49 = 0;
                for (uVar48 = uVar43; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000)
                {
                  lVar49 = lVar49 + 1;
                }
                uVar43 = uVar43 - 1 & uVar43;
                auVar64._8_8_ = 0;
                auVar64._0_8_ = *(ulong *)(uVar47 + lVar49 * 8);
                auVar59 = vpunpcklqdq_avx(auVar64,ZEXT416(*(uint *)(local_1340 + lVar49 * 4)));
                auVar64 = vpcmpgtd_avx(auVar58,auVar54);
                if (uVar43 == 0) {
                  auVar70 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar58,auVar54,auVar70);
                  auVar54 = vblendvps_avx(auVar54,auVar58,auVar70);
                  auVar58 = vpcmpgtd_avx(auVar59,auVar64);
                  auVar70 = vpshufd_avx(auVar58,0xaa);
                  auVar58 = vblendvps_avx(auVar59,auVar64,auVar70);
                  auVar64 = vblendvps_avx(auVar64,auVar59,auVar70);
                  auVar59 = vpcmpgtd_avx(auVar64,auVar54);
                  auVar70 = vpshufd_avx(auVar59,0xaa);
                  auVar59 = vblendvps_avx(auVar64,auVar54,auVar70);
                  auVar54 = vblendvps_avx(auVar54,auVar64,auVar70);
                  *pauVar46 = auVar54;
                  pauVar46[1] = auVar59;
                  uVar48 = auVar58._0_8_;
                  pauVar46 = pauVar46 + 2;
                }
                else {
                  lVar49 = 0;
                  for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                    lVar49 = lVar49 + 1;
                  }
                  auVar70._8_8_ = 0;
                  auVar70._0_8_ = *(ulong *)(uVar47 + lVar49 * 8);
                  auVar65 = vpunpcklqdq_avx(auVar70,ZEXT416(*(uint *)(local_1340 + lVar49 * 4)));
                  auVar70 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar58,auVar54,auVar70);
                  auVar54 = vblendvps_avx(auVar54,auVar58,auVar70);
                  auVar58 = vpcmpgtd_avx(auVar65,auVar59);
                  auVar70 = vpshufd_avx(auVar58,0xaa);
                  auVar58 = vblendvps_avx(auVar65,auVar59,auVar70);
                  auVar59 = vblendvps_avx(auVar59,auVar65,auVar70);
                  auVar70 = vpcmpgtd_avx(auVar59,auVar54);
                  auVar65 = vpshufd_avx(auVar70,0xaa);
                  auVar70 = vblendvps_avx(auVar59,auVar54,auVar65);
                  auVar54 = vblendvps_avx(auVar54,auVar59,auVar65);
                  auVar59 = vpcmpgtd_avx(auVar58,auVar64);
                  auVar65 = vpshufd_avx(auVar59,0xaa);
                  auVar59 = vblendvps_avx(auVar58,auVar64,auVar65);
                  auVar58 = vblendvps_avx(auVar64,auVar58,auVar65);
                  auVar64 = vpcmpgtd_avx(auVar70,auVar58);
                  auVar65 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar70,auVar58,auVar65);
                  auVar58 = vblendvps_avx(auVar58,auVar70,auVar65);
                  *pauVar46 = auVar54;
                  pauVar46[1] = auVar58;
                  pauVar46[2] = auVar64;
                  uVar48 = auVar59._0_8_;
                  pauVar46 = pauVar46 + 3;
                }
              }
            }
          }
        }
        else {
          iVar38 = 6;
        }
      } while (iVar38 == 0);
    } while (iVar38 != 6);
    uVar47 = (ulong)((uint)uVar48 & 0xf);
    if (uVar47 != 8) {
      uVar48 = uVar48 & 0xfffffffffffffff0;
      lVar49 = 0;
      do {
        lVar41 = lVar49 * 0x60;
        pSVar6 = context->scene;
        ppfVar7 = (pSVar6->vertices).items;
        pfVar8 = ppfVar7[*(uint *)(uVar48 + 0x48 + lVar41)];
        auVar61._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar48 + 0x28 + lVar41));
        auVar61._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar48 + 8 + lVar41));
        pfVar9 = ppfVar7[*(uint *)(uVar48 + 0x40 + lVar41)];
        auVar66._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar48 + 0x20 + lVar41));
        auVar66._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar48 + lVar41));
        pfVar10 = ppfVar7[*(uint *)(uVar48 + 0x44 + lVar41)];
        auVar71._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + 0x24 + lVar41));
        auVar71._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + 4 + lVar41));
        pfVar11 = ppfVar7[*(uint *)(uVar48 + 0x4c + lVar41)];
        auVar82._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 0x2c + lVar41));
        auVar82._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 0xc + lVar41));
        lVar1 = uVar48 + 0x40 + lVar41;
        local_10e0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_10d8 = *(undefined8 *)(lVar1 + 0x18);
        uStack_10d0 = local_10e0;
        uStack_10c8 = uStack_10d8;
        lVar1 = uVar48 + 0x50 + lVar41;
        local_1360 = *(undefined8 *)(lVar1 + 0x10);
        uStack_1358 = *(undefined8 *)(lVar1 + 0x18);
        auVar64 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar48 + 0x10 + lVar41)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar48 + 0x18 + lVar41)));
        auVar54 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar48 + 0x10 + lVar41)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar48 + 0x18 + lVar41)));
        auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + 0x14 + lVar41)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 0x1c + lVar41)))
        ;
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + 0x14 + lVar41)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 0x1c + lVar41)))
        ;
        auVar70 = vunpcklps_avx(auVar54,auVar58);
        auVar65 = vunpcklps_avx(auVar64,auVar59);
        auVar54 = vunpckhps_avx(auVar64,auVar59);
        auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar48 + 0x30 + lVar41)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar48 + 0x38 + lVar41)));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar48 + 0x30 + lVar41)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar48 + 0x38 + lVar41)));
        auVar23 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + 0x34 + lVar41)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 0x3c + lVar41)))
        ;
        auVar64 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + 0x34 + lVar41)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 0x3c + lVar41)))
        ;
        auVar64 = vunpcklps_avx(auVar58,auVar64);
        auVar24 = vunpcklps_avx(auVar59,auVar23);
        auVar58 = vunpckhps_avx(auVar59,auVar23);
        uStack_1350 = local_1360;
        uStack_1348 = uStack_1358;
        auVar74 = vunpcklps_avx(auVar71,auVar82);
        auVar55 = vunpcklps_avx(auVar66,auVar61);
        auVar25 = vunpcklps_avx(auVar55,auVar74);
        auVar22 = vunpckhps_avx(auVar55,auVar74);
        auVar74 = vunpckhps_avx(auVar71,auVar82);
        auVar55 = vunpckhps_avx(auVar66,auVar61);
        auVar26 = vunpcklps_avx(auVar55,auVar74);
        auVar62._16_16_ = auVar65;
        auVar62._0_16_ = auVar65;
        auVar67._16_16_ = auVar54;
        auVar67._0_16_ = auVar54;
        auVar56._16_16_ = auVar70;
        auVar56._0_16_ = auVar70;
        auVar72._16_16_ = auVar24;
        auVar72._0_16_ = auVar24;
        auVar87._16_16_ = auVar58;
        auVar87._0_16_ = auVar58;
        auVar50._16_16_ = auVar64;
        auVar50._0_16_ = auVar64;
        auVar55 = vsubps_avx(auVar25,auVar62);
        auVar74 = vsubps_avx(auVar22,auVar67);
        auVar60 = vsubps_avx(auVar26,auVar56);
        auVar56 = vsubps_avx(auVar72,auVar25);
        auVar19 = vsubps_avx(auVar87,auVar22);
        auVar20 = vsubps_avx(auVar50,auVar26);
        auVar21._4_4_ = auVar74._4_4_ * auVar20._4_4_;
        auVar21._0_4_ = auVar74._0_4_ * auVar20._0_4_;
        auVar21._8_4_ = auVar74._8_4_ * auVar20._8_4_;
        auVar21._12_4_ = auVar74._12_4_ * auVar20._12_4_;
        auVar21._16_4_ = auVar74._16_4_ * auVar20._16_4_;
        auVar21._20_4_ = auVar74._20_4_ * auVar20._20_4_;
        auVar21._24_4_ = auVar74._24_4_ * auVar20._24_4_;
        auVar21._28_4_ = auVar64._12_4_;
        auVar59 = vfmsub231ps_fma(auVar21,auVar19,auVar60);
        auVar28._4_4_ = auVar60._4_4_ * auVar56._4_4_;
        auVar28._0_4_ = auVar60._0_4_ * auVar56._0_4_;
        auVar28._8_4_ = auVar60._8_4_ * auVar56._8_4_;
        auVar28._12_4_ = auVar60._12_4_ * auVar56._12_4_;
        auVar28._16_4_ = auVar60._16_4_ * auVar56._16_4_;
        auVar28._20_4_ = auVar60._20_4_ * auVar56._20_4_;
        auVar28._24_4_ = auVar60._24_4_ * auVar56._24_4_;
        auVar28._28_4_ = auVar70._12_4_;
        auVar70 = vfmsub231ps_fma(auVar28,auVar20,auVar55);
        uVar4 = *(undefined4 *)(ray + k * 4);
        auVar68._4_4_ = uVar4;
        auVar68._0_4_ = uVar4;
        auVar68._8_4_ = uVar4;
        auVar68._12_4_ = uVar4;
        auVar68._16_4_ = uVar4;
        auVar68._20_4_ = uVar4;
        auVar68._24_4_ = uVar4;
        auVar68._28_4_ = uVar4;
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar97._4_4_ = uVar4;
        auVar97._0_4_ = uVar4;
        auVar97._8_4_ = uVar4;
        auVar97._12_4_ = uVar4;
        auVar97._16_4_ = uVar4;
        auVar97._20_4_ = uVar4;
        auVar97._24_4_ = uVar4;
        auVar97._28_4_ = uVar4;
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar99._4_4_ = uVar4;
        auVar99._0_4_ = uVar4;
        auVar99._8_4_ = uVar4;
        auVar99._12_4_ = uVar4;
        auVar99._16_4_ = uVar4;
        auVar99._20_4_ = uVar4;
        auVar99._24_4_ = uVar4;
        auVar99._28_4_ = uVar4;
        fVar2 = *(float *)(ray + k * 4 + 0x80);
        auVar88._4_4_ = fVar2;
        auVar88._0_4_ = fVar2;
        auVar88._8_4_ = fVar2;
        auVar88._12_4_ = fVar2;
        auVar88._16_4_ = fVar2;
        auVar88._20_4_ = fVar2;
        auVar88._24_4_ = fVar2;
        auVar88._28_4_ = fVar2;
        auVar25 = vsubps_avx(auVar25,auVar68);
        fVar3 = *(float *)(ray + k * 4 + 0xa0);
        auVar92._4_4_ = fVar3;
        auVar92._0_4_ = fVar3;
        auVar92._8_4_ = fVar3;
        auVar92._12_4_ = fVar3;
        auVar92._16_4_ = fVar3;
        auVar92._20_4_ = fVar3;
        auVar92._24_4_ = fVar3;
        auVar92._28_4_ = fVar3;
        auVar22 = vsubps_avx(auVar22,auVar97);
        fVar76 = *(float *)(ray + k * 4 + 0xc0);
        auVar98._4_4_ = fVar76;
        auVar98._0_4_ = fVar76;
        auVar98._8_4_ = fVar76;
        auVar98._12_4_ = fVar76;
        auVar98._16_4_ = fVar76;
        auVar98._20_4_ = fVar76;
        auVar98._24_4_ = fVar76;
        auVar98._28_4_ = fVar76;
        auVar21 = vsubps_avx(auVar26,auVar99);
        auVar29._4_4_ = fVar2 * auVar22._4_4_;
        auVar29._0_4_ = fVar2 * auVar22._0_4_;
        auVar29._8_4_ = fVar2 * auVar22._8_4_;
        auVar29._12_4_ = fVar2 * auVar22._12_4_;
        auVar29._16_4_ = fVar2 * auVar22._16_4_;
        auVar29._20_4_ = fVar2 * auVar22._20_4_;
        auVar29._24_4_ = fVar2 * auVar22._24_4_;
        auVar29._28_4_ = auVar26._28_4_;
        auVar54 = vfmsub231ps_fma(auVar29,auVar25,auVar92);
        auVar26._4_4_ = auVar20._4_4_ * auVar54._4_4_;
        auVar26._0_4_ = auVar20._0_4_ * auVar54._0_4_;
        auVar26._8_4_ = auVar20._8_4_ * auVar54._8_4_;
        auVar26._12_4_ = auVar20._12_4_ * auVar54._12_4_;
        auVar26._16_4_ = auVar20._16_4_ * 0.0;
        auVar26._20_4_ = auVar20._20_4_ * 0.0;
        auVar26._24_4_ = auVar20._24_4_ * 0.0;
        auVar26._28_4_ = auVar20._28_4_;
        auVar95._0_4_ = auVar60._0_4_ * auVar54._0_4_;
        auVar95._4_4_ = auVar60._4_4_ * auVar54._4_4_;
        auVar95._8_4_ = auVar60._8_4_ * auVar54._8_4_;
        auVar95._12_4_ = auVar60._12_4_ * auVar54._12_4_;
        auVar95._16_4_ = auVar60._16_4_ * 0.0;
        auVar95._20_4_ = auVar60._20_4_ * 0.0;
        auVar95._24_4_ = auVar60._24_4_ * 0.0;
        auVar95._28_4_ = 0;
        auVar20._4_4_ = fVar76 * auVar25._4_4_;
        auVar20._0_4_ = fVar76 * auVar25._0_4_;
        auVar20._8_4_ = fVar76 * auVar25._8_4_;
        auVar20._12_4_ = fVar76 * auVar25._12_4_;
        auVar20._16_4_ = fVar76 * auVar25._16_4_;
        auVar20._20_4_ = fVar76 * auVar25._20_4_;
        auVar20._24_4_ = fVar76 * auVar25._24_4_;
        auVar20._28_4_ = auVar60._28_4_;
        auVar58 = vfmsub231ps_fma(auVar20,auVar21,auVar88);
        auVar54 = vfmadd231ps_fma(auVar26,ZEXT1632(auVar58),auVar19);
        auVar58 = vfmadd231ps_fma(auVar95,auVar74,ZEXT1632(auVar58));
        auVar30._4_4_ = auVar55._4_4_ * auVar19._4_4_;
        auVar30._0_4_ = auVar55._0_4_ * auVar19._0_4_;
        auVar30._8_4_ = auVar55._8_4_ * auVar19._8_4_;
        auVar30._12_4_ = auVar55._12_4_ * auVar19._12_4_;
        auVar30._16_4_ = auVar55._16_4_ * auVar19._16_4_;
        auVar30._20_4_ = auVar55._20_4_ * auVar19._20_4_;
        auVar30._24_4_ = auVar55._24_4_ * auVar19._24_4_;
        auVar30._28_4_ = auVar19._28_4_;
        auVar65 = vfmsub231ps_fma(auVar30,auVar56,auVar74);
        auVar19._4_4_ = fVar3 * auVar21._4_4_;
        auVar19._0_4_ = fVar3 * auVar21._0_4_;
        auVar19._8_4_ = fVar3 * auVar21._8_4_;
        auVar19._12_4_ = fVar3 * auVar21._12_4_;
        auVar19._16_4_ = fVar3 * auVar21._16_4_;
        auVar19._20_4_ = fVar3 * auVar21._20_4_;
        auVar19._24_4_ = fVar3 * auVar21._24_4_;
        auVar19._28_4_ = auVar74._28_4_;
        auVar23 = vfmsub231ps_fma(auVar19,auVar22,auVar98);
        fVar2 = auVar65._0_4_;
        fVar3 = auVar65._4_4_;
        auVar31._4_4_ = fVar76 * fVar3;
        auVar31._0_4_ = fVar76 * fVar2;
        fVar14 = auVar65._8_4_;
        auVar31._8_4_ = fVar76 * fVar14;
        fVar15 = auVar65._12_4_;
        auVar31._12_4_ = fVar76 * fVar15;
        auVar31._16_4_ = fVar76 * 0.0;
        auVar31._20_4_ = fVar76 * 0.0;
        auVar31._24_4_ = fVar76 * 0.0;
        auVar31._28_4_ = fVar76;
        auVar64 = vfmadd231ps_fma(auVar31,ZEXT1632(auVar70),auVar92);
        auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),ZEXT1632(auVar59),auVar88);
        auVar83._8_4_ = 0x80000000;
        auVar83._0_8_ = 0x8000000080000000;
        auVar83._12_4_ = 0x80000000;
        auVar83._16_4_ = 0x80000000;
        auVar83._20_4_ = 0x80000000;
        auVar83._24_4_ = 0x80000000;
        auVar83._28_4_ = 0x80000000;
        auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),ZEXT1632(auVar23),auVar56);
        auVar74 = vandps_avx(ZEXT1632(auVar64),auVar83);
        uVar39 = auVar74._0_4_;
        auVar73._0_4_ = (float)(uVar39 ^ auVar54._0_4_);
        uVar40 = auVar74._4_4_;
        auVar73._4_4_ = (float)(uVar40 ^ auVar54._4_4_);
        uVar85 = auVar74._8_4_;
        auVar73._8_4_ = (float)(uVar85 ^ auVar54._8_4_);
        uVar86 = auVar74._12_4_;
        auVar73._12_4_ = (float)(uVar86 ^ auVar54._12_4_);
        local_1300._16_4_ = auVar74._16_4_;
        auVar73._16_4_ = local_1300._16_4_;
        local_1300._20_4_ = auVar74._20_4_;
        auVar73._20_4_ = local_1300._20_4_;
        local_1300._24_4_ = auVar74._24_4_;
        auVar73._24_4_ = local_1300._24_4_;
        local_1300._28_4_ = auVar74._28_4_;
        auVar73._28_4_ = local_1300._28_4_;
        auVar54 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar55,ZEXT1632(auVar23));
        local_1320._0_4_ = (float)(uVar39 ^ auVar54._0_4_);
        local_1320._4_4_ = (float)(uVar40 ^ auVar54._4_4_);
        local_1320._8_4_ = (float)(uVar85 ^ auVar54._8_4_);
        local_1320._12_4_ = (float)(uVar86 ^ auVar54._12_4_);
        local_1320._16_4_ = local_1300._16_4_;
        local_1320._20_4_ = local_1300._20_4_;
        local_1320._24_4_ = local_1300._24_4_;
        local_1320._28_4_ = local_1300._28_4_;
        auVar74 = vcmpps_avx(auVar73,ZEXT832(0) << 0x20,5);
        auVar55 = vcmpps_avx(local_1320,ZEXT832(0) << 0x20,5);
        auVar74 = vandps_avx(auVar74,auVar55);
        auVar77._8_4_ = 0x7fffffff;
        auVar77._0_8_ = 0x7fffffff7fffffff;
        auVar77._12_4_ = 0x7fffffff;
        auVar77._16_4_ = 0x7fffffff;
        auVar77._20_4_ = 0x7fffffff;
        auVar77._24_4_ = 0x7fffffff;
        auVar77._28_4_ = 0x7fffffff;
        local_12e0 = vandps_avx(ZEXT1632(auVar64),auVar77);
        auVar55 = vcmpps_avx(ZEXT1632(auVar64),ZEXT832(0) << 0x20,4);
        auVar74 = vandps_avx(auVar74,auVar55);
        auVar90._0_4_ = auVar73._0_4_ + local_1320._0_4_;
        auVar90._4_4_ = auVar73._4_4_ + local_1320._4_4_;
        auVar90._8_4_ = auVar73._8_4_ + local_1320._8_4_;
        auVar90._12_4_ = auVar73._12_4_ + local_1320._12_4_;
        auVar90._16_4_ = local_1300._16_4_ + local_1300._16_4_;
        auVar90._20_4_ = local_1300._20_4_ + local_1300._20_4_;
        auVar90._24_4_ = local_1300._24_4_ + local_1300._24_4_;
        auVar90._28_4_ = local_1300._28_4_ + local_1300._28_4_;
        auVar55 = vcmpps_avx(auVar90,local_12e0,2);
        auVar60 = auVar55 & auVar74;
        if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar60 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar60 >> 0x7f,0) != '\0') ||
              (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar60 >> 0xbf,0) != '\0') ||
            (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar60[0x1f] < '\0') {
          auVar74 = vandps_avx(auVar74,auVar55);
          auVar54 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
          auVar32._4_4_ = fVar3 * auVar21._4_4_;
          auVar32._0_4_ = fVar2 * auVar21._0_4_;
          auVar32._8_4_ = fVar14 * auVar21._8_4_;
          auVar32._12_4_ = fVar15 * auVar21._12_4_;
          auVar32._16_4_ = auVar21._16_4_ * 0.0;
          auVar32._20_4_ = auVar21._20_4_ * 0.0;
          auVar32._24_4_ = auVar21._24_4_ * 0.0;
          auVar32._28_4_ = auVar21._28_4_;
          auVar58 = vfmadd213ps_fma(auVar22,ZEXT1632(auVar70),auVar32);
          auVar58 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar59),ZEXT1632(auVar58));
          local_1300._0_4_ = (float)(uVar39 ^ auVar58._0_4_);
          local_1300._4_4_ = (float)(uVar40 ^ auVar58._4_4_);
          local_1300._8_4_ = (float)(uVar85 ^ auVar58._8_4_);
          local_1300._12_4_ = (float)(uVar86 ^ auVar58._12_4_);
          fVar76 = *(float *)(ray + k * 4 + 0x60);
          auVar25._4_4_ = local_12e0._4_4_ * fVar76;
          auVar25._0_4_ = local_12e0._0_4_ * fVar76;
          auVar25._8_4_ = local_12e0._8_4_ * fVar76;
          auVar25._12_4_ = local_12e0._12_4_ * fVar76;
          auVar25._16_4_ = local_12e0._16_4_ * fVar76;
          auVar25._20_4_ = local_12e0._20_4_ * fVar76;
          auVar25._24_4_ = local_12e0._24_4_ * fVar76;
          auVar25._28_4_ = fVar76;
          auVar74 = vcmpps_avx(auVar25,local_1300,1);
          fVar76 = *(float *)(ray + k * 4 + 0x100);
          auVar22._4_4_ = local_12e0._4_4_ * fVar76;
          auVar22._0_4_ = local_12e0._0_4_ * fVar76;
          auVar22._8_4_ = local_12e0._8_4_ * fVar76;
          auVar22._12_4_ = local_12e0._12_4_ * fVar76;
          auVar22._16_4_ = local_12e0._16_4_ * fVar76;
          auVar22._20_4_ = local_12e0._20_4_ * fVar76;
          auVar22._24_4_ = local_12e0._24_4_ * fVar76;
          auVar22._28_4_ = fVar76;
          auVar55 = vcmpps_avx(local_1300,auVar22,2);
          auVar74 = vandps_avx(auVar74,auVar55);
          auVar58 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
          auVar54 = vpand_avx(auVar54,auVar58);
          auVar74 = vpmovzxwd_avx2(auVar54);
          auVar74 = vpslld_avx2(auVar74,0x1f);
          if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar74 >> 0x7f,0) != '\0') ||
                (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar74 >> 0xbf,0) != '\0') ||
              (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar74[0x1f] < '\0') {
            local_1420 = vpsrad_avx2(auVar74,0x1f);
            local_1340 = auVar73;
            local_12c0 = ZEXT1632(auVar59);
            local_12a0 = ZEXT1632(auVar70);
            local_1280 = ZEXT1632(auVar65);
            local_1260 = local_1420;
            local_1180 = local_1100;
            auVar55 = vrcpps_avx(local_12e0);
            auVar93._8_4_ = 0x3f800000;
            auVar93._0_8_ = &DAT_3f8000003f800000;
            auVar93._12_4_ = 0x3f800000;
            auVar93._16_4_ = 0x3f800000;
            auVar93._20_4_ = 0x3f800000;
            auVar93._24_4_ = 0x3f800000;
            auVar93._28_4_ = 0x3f800000;
            auVar58 = vfnmadd213ps_fma(local_12e0,auVar55,auVar93);
            auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar55,auVar55);
            fVar76 = auVar58._0_4_;
            fVar79 = auVar58._4_4_;
            local_1200._4_4_ = fVar79 * local_1300._4_4_;
            local_1200._0_4_ = fVar76 * local_1300._0_4_;
            fVar80 = auVar58._8_4_;
            local_1200._8_4_ = fVar80 * local_1300._8_4_;
            fVar81 = auVar58._12_4_;
            local_1200._12_4_ = fVar81 * local_1300._12_4_;
            local_1200._16_4_ = local_1300._16_4_ * 0.0;
            local_1200._20_4_ = local_1300._20_4_ * 0.0;
            local_1200._24_4_ = local_1300._24_4_ * 0.0;
            local_1200._28_4_ = auVar55._28_4_;
            auVar53 = ZEXT3264(local_1200);
            auVar33._4_4_ = fVar79 * auVar73._4_4_;
            auVar33._0_4_ = fVar76 * auVar73._0_4_;
            auVar33._8_4_ = fVar80 * auVar73._8_4_;
            auVar33._12_4_ = fVar81 * auVar73._12_4_;
            auVar33._16_4_ = local_1300._16_4_ * 0.0;
            auVar33._20_4_ = local_1300._20_4_ * 0.0;
            auVar33._24_4_ = local_1300._24_4_ * 0.0;
            auVar33._28_4_ = local_1300._28_4_;
            auVar55 = vminps_avx(auVar33,auVar93);
            auVar34._4_4_ = fVar79 * local_1320._4_4_;
            auVar34._0_4_ = fVar76 * local_1320._0_4_;
            auVar34._8_4_ = fVar80 * local_1320._8_4_;
            auVar34._12_4_ = fVar81 * local_1320._12_4_;
            auVar34._16_4_ = local_1300._16_4_ * 0.0;
            auVar34._20_4_ = local_1300._20_4_ * 0.0;
            auVar34._24_4_ = local_1300._24_4_ * 0.0;
            auVar34._28_4_ = local_1300._28_4_;
            auVar60 = vminps_avx(auVar34,auVar93);
            auVar56 = vsubps_avx(auVar93,auVar55);
            auVar19 = vsubps_avx(auVar93,auVar60);
            local_1220 = vblendvps_avx(auVar60,auVar56,local_1100);
            local_1240 = vblendvps_avx(auVar55,auVar19,local_1100);
            fVar76 = local_1120._0_4_;
            local_11e0._0_4_ = auVar59._0_4_ * fVar76;
            fVar79 = local_1120._4_4_;
            local_11e0._4_4_ = auVar59._4_4_ * fVar79;
            fVar80 = local_1120._8_4_;
            local_11e0._8_4_ = auVar59._8_4_ * fVar80;
            fVar81 = local_1120._12_4_;
            local_11e0._12_4_ = auVar59._12_4_ * fVar81;
            fVar16 = local_1120._16_4_;
            local_11e0._16_4_ = fVar16 * 0.0;
            fVar17 = local_1120._20_4_;
            local_11e0._20_4_ = fVar17 * 0.0;
            fVar18 = local_1120._24_4_;
            local_11e0._24_4_ = fVar18 * 0.0;
            local_11e0._28_4_ = 0;
            local_11c0._0_4_ = fVar76 * auVar70._0_4_;
            local_11c0._4_4_ = fVar79 * auVar70._4_4_;
            local_11c0._8_4_ = fVar80 * auVar70._8_4_;
            local_11c0._12_4_ = fVar81 * auVar70._12_4_;
            local_11c0._16_4_ = fVar16 * 0.0;
            local_11c0._20_4_ = fVar17 * 0.0;
            local_11c0._24_4_ = fVar18 * 0.0;
            local_11c0._28_4_ = 0;
            local_11a0._0_4_ = fVar76 * fVar2;
            local_11a0._4_4_ = fVar79 * fVar3;
            local_11a0._8_4_ = fVar80 * fVar14;
            local_11a0._12_4_ = fVar81 * fVar15;
            local_11a0._16_4_ = fVar16 * 0.0;
            local_11a0._20_4_ = fVar17 * 0.0;
            local_11a0._24_4_ = fVar18 * 0.0;
            local_11a0._28_4_ = 0;
            auVar51._8_4_ = 0x7f800000;
            auVar51._0_8_ = 0x7f8000007f800000;
            auVar51._12_4_ = 0x7f800000;
            auVar51._16_4_ = 0x7f800000;
            auVar51._20_4_ = 0x7f800000;
            auVar51._24_4_ = 0x7f800000;
            auVar51._28_4_ = 0x7f800000;
            auVar74 = vblendvps_avx(auVar51,local_1200,auVar74);
            auVar55 = vshufps_avx(auVar74,auVar74,0xb1);
            auVar55 = vminps_avx(auVar74,auVar55);
            auVar60 = vshufpd_avx(auVar55,auVar55,5);
            auVar55 = vminps_avx(auVar55,auVar60);
            auVar60 = vpermpd_avx2(auVar55,0x4e);
            auVar55 = vminps_avx(auVar55,auVar60);
            auVar74 = vcmpps_avx(auVar74,auVar55,0);
            auVar58 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
            auVar54 = vpand_avx(auVar58,auVar54);
            auVar74 = vpmovzxwd_avx2(auVar54);
            auVar74 = vpslld_avx2(auVar74,0x1f);
            if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar74 >> 0x7f,0) == '\0') &&
                  (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar74 >> 0xbf,0) == '\0') &&
                (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar74[0x1f]) {
              auVar74 = local_1420;
            }
            uVar40 = vmovmskps_avx(auVar74);
            uVar39 = 0;
            for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x80000000) {
              uVar39 = uVar39 + 1;
            }
            do {
              uVar43 = (ulong)uVar39;
              uVar39 = *(uint *)((long)&local_10e0 + uVar43 * 4);
              pGVar12 = (pSVar6->geometries).items[uVar39].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_1420 + uVar43 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar4 = *(undefined4 *)(local_1240 + uVar43 * 4);
                  uVar5 = *(undefined4 *)(local_1220 + uVar43 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1200 + uVar43 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_11e0 + uVar43 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_11c0 + uVar43 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_11a0 + uVar43 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar5;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)((long)&local_1360 + uVar43 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar39;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                local_1160 = auVar53._0_32_;
                uVar4 = *(undefined4 *)(local_1240 + uVar43 * 4);
                local_1060._4_4_ = uVar4;
                local_1060._0_4_ = uVar4;
                local_1060._8_4_ = uVar4;
                local_1060._12_4_ = uVar4;
                local_1060._16_4_ = uVar4;
                local_1060._20_4_ = uVar4;
                local_1060._24_4_ = uVar4;
                local_1060._28_4_ = uVar4;
                local_1040 = *(undefined4 *)(local_1220 + uVar43 * 4);
                uVar4 = *(undefined4 *)((long)&local_1360 + uVar43 * 4);
                auVar65._4_4_ = uVar4;
                auVar65._0_4_ = uVar4;
                auVar65._8_4_ = uVar4;
                auVar65._12_4_ = uVar4;
                auVar69._16_4_ = uVar4;
                auVar69._0_16_ = auVar65;
                auVar69._20_4_ = uVar4;
                auVar69._24_4_ = uVar4;
                auVar69._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_11e0 + uVar43 * 4);
                uVar5 = *(undefined4 *)(local_11c0 + uVar43 * 4);
                local_10a0._4_4_ = uVar5;
                local_10a0._0_4_ = uVar5;
                local_10a0._8_4_ = uVar5;
                local_10a0._12_4_ = uVar5;
                local_10a0._16_4_ = uVar5;
                local_10a0._20_4_ = uVar5;
                local_10a0._24_4_ = uVar5;
                local_10a0._28_4_ = uVar5;
                uVar5 = *(undefined4 *)(local_11a0 + uVar43 * 4);
                local_1080._4_4_ = uVar5;
                local_1080._0_4_ = uVar5;
                local_1080._8_4_ = uVar5;
                local_1080._12_4_ = uVar5;
                local_1080._16_4_ = uVar5;
                local_1080._20_4_ = uVar5;
                local_1080._24_4_ = uVar5;
                local_1080._28_4_ = uVar5;
                auVar59._4_4_ = uVar39;
                auVar59._0_4_ = uVar39;
                auVar59._8_4_ = uVar39;
                auVar59._12_4_ = uVar39;
                auVar63._16_4_ = uVar39;
                auVar63._0_16_ = auVar59;
                auVar63._20_4_ = uVar39;
                auVar63._24_4_ = uVar39;
                auVar63._28_4_ = uVar39;
                local_10c0[0] = (RTCHitN)(char)uVar4;
                local_10c0[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[4] = (RTCHitN)(char)uVar4;
                local_10c0[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[8] = (RTCHitN)(char)uVar4;
                local_10c0[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[0xc] = (RTCHitN)(char)uVar4;
                local_10c0[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[0x10] = (RTCHitN)(char)uVar4;
                local_10c0[0x11] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[0x14] = (RTCHitN)(char)uVar4;
                local_10c0[0x15] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[0x18] = (RTCHitN)(char)uVar4;
                local_10c0[0x19] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[0x1c] = (RTCHitN)(char)uVar4;
                local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                local_1020 = auVar69;
                local_1000 = auVar63;
                vpcmpeqd_avx2(local_1060,local_1060);
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1200 + uVar43 * 4);
                local_1400 = local_1140._0_8_;
                uStack_13f8 = local_1140._8_8_;
                uStack_13f0 = local_1140._16_8_;
                uStack_13e8 = local_1140._24_8_;
                local_1450.valid = (int *)&local_1400;
                local_1450.geometryUserPtr = pGVar12->userPtr;
                local_1450.context = context->user;
                local_1450.hit = local_10c0;
                local_1450.N = 8;
                local_1450.ray = (RTCRayN *)ray;
                if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar63 = ZEXT1632(auVar59);
                  auVar69 = ZEXT1632(auVar65);
                  (*pGVar12->intersectionFilterN)(&local_1450);
                }
                auVar35._8_8_ = uStack_13f8;
                auVar35._0_8_ = local_1400;
                auVar35._16_8_ = uStack_13f0;
                auVar35._24_8_ = uStack_13e8;
                auVar55 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar35);
                auVar74 = _DAT_0205a980 & ~auVar55;
                if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar74 >> 0x7f,0) == '\0') &&
                      (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar74 >> 0xbf,0) == '\0') &&
                    (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar74[0x1f]) {
                  auVar53 = ZEXT3264(auVar55 ^ _DAT_0205a980);
                }
                else {
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar63 = ZEXT1632(auVar63._0_16_);
                    auVar69 = ZEXT1632(auVar69._0_16_);
                    (*p_Var13)(&local_1450);
                  }
                  auVar36._8_8_ = uStack_13f8;
                  auVar36._0_8_ = local_1400;
                  auVar36._16_8_ = uStack_13f0;
                  auVar36._24_8_ = uStack_13e8;
                  auVar55 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar36);
                  auVar74 = vpcmpeqd_avx2(auVar69,auVar69);
                  auVar53 = ZEXT3264(auVar55 ^ auVar74);
                  auVar60 = vpcmpeqd_avx2(auVar63,auVar63);
                  auVar74 = auVar74 & ~auVar55;
                  if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar74 >> 0x7f,0) != '\0') ||
                        (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar74 >> 0xbf,0) != '\0') ||
                      (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar74[0x1f] < '\0') {
                    auVar55 = auVar55 ^ auVar60;
                    auVar74 = vmaskmovps_avx(auVar55,*(undefined1 (*) [32])local_1450.hit);
                    *(undefined1 (*) [32])(local_1450.ray + 0x180) = auVar74;
                    auVar74 = vmaskmovps_avx(auVar55,*(undefined1 (*) [32])(local_1450.hit + 0x20));
                    *(undefined1 (*) [32])(local_1450.ray + 0x1a0) = auVar74;
                    auVar74 = vmaskmovps_avx(auVar55,*(undefined1 (*) [32])(local_1450.hit + 0x40));
                    *(undefined1 (*) [32])(local_1450.ray + 0x1c0) = auVar74;
                    auVar74 = vmaskmovps_avx(auVar55,*(undefined1 (*) [32])(local_1450.hit + 0x60));
                    *(undefined1 (*) [32])(local_1450.ray + 0x1e0) = auVar74;
                    auVar74 = vmaskmovps_avx(auVar55,*(undefined1 (*) [32])(local_1450.hit + 0x80));
                    *(undefined1 (*) [32])(local_1450.ray + 0x200) = auVar74;
                    auVar74 = vpmaskmovd_avx2(auVar55,*(undefined1 (*) [32])(local_1450.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_1450.ray + 0x220) = auVar74;
                    auVar74 = vpmaskmovd_avx2(auVar55,*(undefined1 (*) [32])(local_1450.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_1450.ray + 0x240) = auVar74;
                    auVar74 = vpmaskmovd_avx2(auVar55,*(undefined1 (*) [32])(local_1450.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_1450.ray + 0x260) = auVar74;
                    auVar74 = vpmaskmovd_avx2(auVar55,*(undefined1 (*) [32])(local_1450.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_1450.ray + 0x280) = auVar74;
                  }
                }
                auVar74 = auVar53._0_32_;
                if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar74 >> 0x7f,0) == '\0') &&
                      (auVar53 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                     SUB321(auVar74 >> 0xbf,0) == '\0') &&
                    (auVar53 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                    -1 < auVar53[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                }
                *(undefined4 *)(local_1420 + uVar43 * 4) = 0;
                uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar52._4_4_ = uVar4;
                auVar52._0_4_ = uVar4;
                auVar52._8_4_ = uVar4;
                auVar52._12_4_ = uVar4;
                auVar52._16_4_ = uVar4;
                auVar52._20_4_ = uVar4;
                auVar52._24_4_ = uVar4;
                auVar52._28_4_ = uVar4;
                auVar53 = ZEXT3264(local_1160);
                auVar74 = vcmpps_avx(local_1160,auVar52,2);
                local_1420 = vandps_avx(auVar74,local_1420);
              }
              if ((((((((local_1420 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1420 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1420 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1420 >> 0x7f,0) == '\0') &&
                    (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_1420 >> 0xbf,0) == '\0') &&
                  (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_1420[0x1f]) break;
              auVar57._8_4_ = 0x7f800000;
              auVar57._0_8_ = 0x7f8000007f800000;
              auVar57._12_4_ = 0x7f800000;
              auVar57._16_4_ = 0x7f800000;
              auVar57._20_4_ = 0x7f800000;
              auVar57._24_4_ = 0x7f800000;
              auVar57._28_4_ = 0x7f800000;
              auVar74 = vblendvps_avx(auVar57,auVar53._0_32_,local_1420);
              auVar55 = vshufps_avx(auVar74,auVar74,0xb1);
              auVar55 = vminps_avx(auVar74,auVar55);
              auVar60 = vshufpd_avx(auVar55,auVar55,5);
              auVar55 = vminps_avx(auVar55,auVar60);
              auVar60 = vpermpd_avx2(auVar55,0x4e);
              auVar55 = vminps_avx(auVar55,auVar60);
              auVar55 = vcmpps_avx(auVar74,auVar55,0);
              auVar60 = local_1420 & auVar55;
              auVar74 = local_1420;
              if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar60 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar60 >> 0x7f,0) != '\0') ||
                    (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar60 >> 0xbf,0) != '\0') ||
                  (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar60[0x1f] < '\0') {
                auVar74 = vandps_avx(auVar55,local_1420);
              }
              uVar40 = vmovmskps_avx(auVar74);
              uVar39 = 0;
              for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x80000000) {
                uVar39 = uVar39 + 1;
              }
            } while( true );
          }
        }
        lVar49 = lVar49 + 1;
      } while (lVar49 != uVar47 - 8);
    }
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar53 = ZEXT1664(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))));
    auVar75 = ZEXT1664(local_1370);
    auVar78 = ZEXT1664(local_1380);
    auVar84 = ZEXT1664(local_1390);
    auVar89 = ZEXT1664(local_13a0);
    auVar91 = ZEXT1664(local_13b0);
    auVar94 = ZEXT1664(local_13c0);
    auVar96 = ZEXT1664(local_13d0);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }